

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InlinePass::IsInlinableFunctionCall(InlinePass *this,Instruction *inst)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppFVar2;
  long *plVar3;
  _Base_ptr p_Var4;
  size_t *psVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  uint32_t calleeFnId;
  string message;
  _Rb_tree_color local_7c;
  spv_position_t local_78;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  if (inst->opcode_ != OpFunctionCall) {
    return false;
  }
  local_7c = Instruction::GetSingleWordOperand(inst,2);
  p_Var4 = (this->inlinable_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->inlinable_)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      bVar8 = p_Var4[1]._M_color < local_7c;
      if (!bVar8) {
        p_Var7 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar8];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var7[1]._M_color <= local_7c)) {
      p_Var4 = (this->early_return_funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var4 == (_Base_ptr)0x0) {
        return true;
      }
      p_Var1 = &(this->early_return_funcs_)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = &p_Var1->_M_header;
      do {
        bVar8 = p_Var4[1]._M_color < local_7c;
        if (!bVar8) {
          p_Var7 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[bVar8];
      } while (p_Var4 != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var7 == p_Var1) {
        return true;
      }
      if (local_7c < p_Var7[1]._M_color) {
        return true;
      }
      ppFVar2 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->id2function_,&local_7c);
      Instruction::PrettyPrint_abi_cxx11_
                (&local_38,
                 ((*ppFVar2)->def_inst_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,0);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x7829ed);
      psVar5 = (size_t *)(plVar3 + 2);
      if ((size_t *)*plVar3 == psVar5) {
        local_78.index = *psVar5;
        lStack_60 = plVar3[3];
        local_78.line = (size_t)&local_78.index;
      }
      else {
        local_78.index = *psVar5;
        local_78.line = (size_t)*plVar3;
      }
      local_78.column = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_48 = *plVar6;
        lStack_40 = plVar3[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar6;
        local_58 = (long *)*plVar3;
      }
      local_50 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((size_t *)local_78.line != &local_78.index) {
        operator_delete((void *)local_78.line,local_78.index + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      local_78.line = 0;
      local_78.column = 0;
      local_78.index = 0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&(this->super_Pass).consumer_,SPV_MSG_WARNING,"",&local_78,(char *)local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
    }
  }
  return false;
}

Assistant:

bool InlinePass::IsInlinableFunctionCall(const Instruction* inst) {
  if (inst->opcode() != spv::Op::OpFunctionCall) return false;
  const uint32_t calleeFnId =
      inst->GetSingleWordOperand(kSpvFunctionCallFunctionId);
  const auto ci = inlinable_.find(calleeFnId);
  if (ci == inlinable_.cend()) return false;

  if (early_return_funcs_.find(calleeFnId) != early_return_funcs_.end()) {
    // We rely on the merge-return pass to handle the early return case
    // in advance.
    std::string message =
        "The function '" + id2function_[calleeFnId]->DefInst().PrettyPrint() +
        "' could not be inlined because the return instruction "
        "is not at the end of the function. This could be fixed by "
        "running merge-return before inlining.";
    consumer()(SPV_MSG_WARNING, "", {0, 0, 0}, message.c_str());
    return false;
  }

  return true;
}